

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_info.cpp
# Opt level: O1

void show_mpp_version(void)

{
  uint in_EAX;
  long lVar1;
  RK_U32 show_history;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  mpp_env_get_u32("mpp_show_history",(long)&uStack_28 + 4,0);
  if (uStack_28._4_4_ == 0) {
    _mpp_log_l(4,"mpp_info","mpp version: %s\n",0,
               "ff3ae5c0 author: Xiaobo Liu    2025-04-11 fix[mpi]: Fix typo");
  }
  else {
    _mpp_log_l(4,"mpp_info","mpp version history %d:\n",0,10);
    lVar1 = 0;
    do {
      _mpp_log_l(4,"mpp_info","%s\n",0,
                 (long)&_ZL11mpp_history_rel + (long)*(int *)((long)&_ZL11mpp_history_rel + lVar1));
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0x28);
  }
  return;
}

Assistant:

void show_mpp_version(void)
{
    RK_U32 show_history = 0;

    mpp_env_get_u32("mpp_show_history", &show_history, 0);

    if (show_history) {
        RK_S32 i;

        mpp_log("mpp version history %d:\n", mpp_history_cnt);
        for (i = 0; i < mpp_history_cnt; i++)
            mpp_log("%s\n", mpp_history[i]);
    } else
        mpp_log("mpp version: %s\n", mpp_version);
}